

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O3

int __thiscall QAccessibleTabBar::indexOfChild(QAccessibleTabBar *this,QAccessibleInterface *child)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  QAccessibleTabBar *pQVar5;
  QTabBar *pQVar6;
  QAccessibleTabButton *tabButton;
  
  lVar3 = (**(code **)(*(long *)child + 0x18))(child);
  if (lVar3 != 0) {
    lVar3 = (**(code **)(*(long *)child + 0x18))(child);
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    lVar4 = QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
    if (lVar3 == *(long *)(*(long *)(lVar4 + 8) + 0x290)) {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar6 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
      iVar2 = QTabBar::count(pQVar6);
      return iVar2;
    }
  }
  lVar3 = (**(code **)(*(long *)child + 0x18))(child);
  if (lVar3 != 0) {
    lVar3 = (**(code **)(*(long *)child + 0x18))(child);
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    lVar4 = QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
    if (lVar3 == *(long *)(*(long *)(lVar4 + 8) + 0x288)) {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar6 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
      iVar2 = QTabBar::count(pQVar6);
      return iVar2 + 1;
    }
  }
  iVar1 = (**(code **)(*(long *)child + 0x78))(child);
  iVar2 = -1;
  if ((iVar1 == 0x25) &&
     (pQVar5 = (QAccessibleTabBar *)(**(code **)(*(long *)child + 0x40))(child), pQVar5 == this)) {
    iVar2 = *(int *)(child + 0x20);
  }
  return iVar2;
}

Assistant:

int QAccessibleTabBar::indexOfChild(const QAccessibleInterface *child) const
{
    if (child->object() && child->object() == tabBar()->d_func()->leftB)
        return tabBar()->count();
    if (child->object() && child->object() == tabBar()->d_func()->rightB)
        return tabBar()->count() + 1;
    if (child->role() == QAccessible::PageTab) {
        QAccessibleInterface *parent = child->parent();
        if (parent == this) {
            const QAccessibleTabButton *tabButton = static_cast<const QAccessibleTabButton *>(child);
            return tabButton->index();
        }
    }
    return -1;
}